

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::LifetimeTests::details::ResultCollector::addResult
          (ResultCollector *this,qpTestResult result,char *msg)

{
  ostringstream *this_00;
  size_t sVar1;
  bool bVar2;
  undefined1 local_1a0 [384];
  
  local_1a0._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"// Fail: ",9);
  if (msg == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1a0._8_8_ + -0x18));
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,msg,sVar1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  if (this->m_result != QP_TEST_RESULT_PASS) {
    msg = "Multiple problems, see log for details";
    bVar2 = result != QP_TEST_RESULT_FAIL;
    result = QP_TEST_RESULT_FAIL;
    if (bVar2) goto LAB_0047465f;
  }
  this->m_result = result;
LAB_0047465f:
  this->m_message = msg;
  return;
}

Assistant:

void ResultCollector::addResult (qpTestResult result, const char* msg)
{
	m_log << TestLog::Message << "// Fail: " << msg << TestLog::EndMessage;
	if (m_result == QP_TEST_RESULT_PASS)
	{
		m_result = result;
		m_message = msg;
	}
	else
	{
		if (result == QP_TEST_RESULT_FAIL)
			m_result = result;
		m_message = "Multiple problems, see log for details";
	}
}